

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_4f553::IntrusiveListTest::AssertListEq
          (IntrusiveListTest *this,TestObjectList *list,vector<int,_std::allocator<int>_> *expected)

{
  TestObjectList *__n;
  bool bVar1;
  const_reference lhs;
  char *pcVar2;
  const_iterator rhs;
  AssertHelper local_b8;
  Message local_b0;
  size_type local_a8;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_88;
  Message local_80;
  undefined1 local_78 [8];
  AssertionResult gtest_ar;
  TestObject *node;
  const_iterator __end2;
  const_iterator __begin2;
  TestObjectList *__range2;
  size_t count;
  vector<int,_std::allocator<int>_> *expected_local;
  TestObjectList *list_local;
  IntrusiveListTest *this_local;
  
  __range2 = (TestObjectList *)0x0;
  count = (size_t)expected;
  expected_local = (vector<int,_std::allocator<int>_> *)list;
  list_local = (TestObjectList *)this;
  join_0x00000010_0x00000000_ = wabt::intrusive_list<(anonymous_namespace)::TestObject>::begin(list)
  ;
  rhs = wabt::intrusive_list<(anonymous_namespace)::TestObject>::end(list);
  while( true ) {
    bVar1 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator::operator!=
                      ((const_iterator *)&__end2.node_,rhs);
    if (!bVar1) {
      local_a8 = std::vector<int,_std::allocator<int>_>::size
                           ((vector<int,_std::allocator<int>_> *)count);
      testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
                ((EqHelper<false> *)local_a0,"count","expected.size()",(unsigned_long *)&__range2,
                 &local_a8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
      if (!bVar1) {
        testing::Message::Message(&local_b0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
        testing::internal::AssertHelper::AssertHelper
                  (&local_b8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-intrusive-list.cc"
                   ,0x5b,pcVar2);
        testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
        testing::internal::AssertHelper::~AssertHelper(&local_b8);
        testing::Message::~Message(&local_b0);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
      return;
    }
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator::operator*
                   ((const_iterator *)&__end2.node_);
    __n = __range2;
    __range2 = (TestObjectList *)((long)&__range2->first_ + 1);
    lhs = std::vector<int,_std::allocator<int>_>::operator[]
                    ((vector<int,_std::allocator<int>_> *)count,(size_type)__n);
    testing::internal::EqHelper<false>::Compare<int,int>
              ((EqHelper<false> *)local_78,"expected[count++]","node.data",lhs,
               (int *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
    if (!bVar1) {
      testing::Message::Message(&local_80);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-intrusive-list.cc"
                 ,0x59,pcVar2);
      testing::internal::AssertHelper::operator=(&local_88,&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      testing::Message::~Message(&local_80);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
    if (gtest_ar_1.message_.ptr_._4_4_ != 0) break;
    wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator::operator++
              ((const_iterator *)&__end2.node_);
  }
  return;
}

Assistant:

void AssertListEq(const TestObjectList& list,
                    const std::vector<int>& expected) {
    size_t count = 0;
    for (const TestObject& node : list) {
      ASSERT_EQ(expected[count++], node.data);
    }
    ASSERT_EQ(count, expected.size());
  }